

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlParserShrink(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr input;
  xmlParserInputBufferPtr pxVar1;
  size_t sVar2;
  size_t res;
  size_t used;
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr in;
  xmlParserCtxtPtr ctxt_local;
  
  input = ctxt->input;
  pxVar1 = input->buf;
  if ((pxVar1 != (xmlParserInputBufferPtr)0x0) &&
     (res = (long)input->cur - (long)input->base, 0x50 < res)) {
    sVar2 = xmlBufShrink(pxVar1->buffer,res - 0x50);
    if (sVar2 != 0) {
      res = res - sVar2;
      if (-sVar2 - 1 < input->consumed) {
        input->consumed = 0xffffffffffffffff;
      }
      else {
        input->consumed = sVar2 + input->consumed;
      }
    }
    xmlBufUpdateInput(pxVar1->buffer,input,res);
  }
  return;
}

Assistant:

void
xmlParserShrink(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr in = ctxt->input;
    xmlParserInputBufferPtr buf = in->buf;
    size_t used, res;

    if (buf == NULL)
        return;

    used = in->cur - in->base;

    if (used > LINE_LEN) {
        res = xmlBufShrink(buf->buffer, used - LINE_LEN);

        if (res > 0) {
            used -= res;
            if ((res > ULONG_MAX) ||
                (in->consumed > ULONG_MAX - (unsigned long)res))
                in->consumed = ULONG_MAX;
            else
                in->consumed += res;
        }

        xmlBufUpdateInput(buf->buffer, in, used);
    }
}